

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall
spdlog::details::async_msg::async_msg
          (async_msg *this,async_logger_ptr *worker,async_msg_type the_type)

{
  undefined4 in_EDX;
  shared_ptr<spdlog::async_logger> *in_RDI;
  log_msg_buffer *unaff_retaddr;
  shared_ptr<spdlog::async_logger> *in_stack_ffffffffffffffd8;
  
  memset(in_RDI,0,0x180);
  log_msg_buffer::log_msg_buffer(unaff_retaddr);
  *(undefined4 *)
   &in_RDI[0x18].super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_EDX;
  std::shared_ptr<spdlog::async_logger>::shared_ptr(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

async_msg(async_logger_ptr &&worker, async_msg_type the_type)
        : log_msg_buffer{}
        , msg_type{the_type}
        , worker_ptr{std::move(worker)}
    {}